

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkTestTools.cpp
# Opt level: O0

void test::LogTonkStatus(SDKConnection *connection)

{
  ostream *poVar1;
  OutputWorker *this;
  LogStringBuffer *buffer_00;
  ostringstream ss;
  TonkStatusEx statusEx;
  TonkStatus status;
  LogStringBuffer buffer;
  char *in_stack_fffffffffffffa28;
  LogStringBuffer *in_stack_fffffffffffffa30;
  string local_508 [48];
  ostringstream local_4d8 [384];
  char local_358 [40];
  ushort local_330;
  char local_32e [40];
  ushort local_306;
  ushort local_304;
  ushort local_302;
  uint local_300;
  uint local_2fc;
  float local_2f8;
  uint local_2f0;
  float local_2ec;
  uint local_2e8;
  uint local_2e0;
  uint local_2dc;
  uint local_2d8;
  uint local_2d4;
  uint local_2d0;
  string *local_2c0;
  char *local_2b8;
  undefined8 *local_2b0;
  string *local_2a8;
  char *local_2a0;
  undefined4 local_294;
  undefined8 *local_290;
  undefined4 local_284;
  undefined8 *local_280;
  undefined1 local_268 [16];
  ostream aoStack_258 [376];
  string *local_e0;
  char *local_d8;
  undefined4 local_cc;
  undefined8 *local_c8;
  string *local_c0;
  char *local_b8;
  undefined *local_b0;
  undefined1 *local_a8;
  undefined8 *local_a0;
  undefined *local_98;
  undefined1 *local_90;
  undefined8 *local_88;
  undefined *local_80;
  undefined1 *local_78;
  string *local_70;
  char *local_68;
  undefined1 *local_60;
  undefined8 *local_58;
  string *local_50;
  undefined1 *local_48;
  undefined8 *local_40;
  string *local_38;
  undefined1 *local_30;
  char *local_28;
  undefined1 *local_20;
  undefined8 *local_18;
  char *local_10;
  undefined1 *local_8;
  
  tonk::SDKConnection::GetStatus((SDKConnection *)in_stack_fffffffffffffa30);
  tonk::SDKConnection::GetStatusEx((SDKConnection *)in_stack_fffffffffffffa30);
  std::__cxx11::ostringstream::ostringstream(local_4d8);
  if ((local_2e0 & 0x1000000) != 0) {
    std::operator<<((ostream *)local_4d8,"TonkFlag_Connecting ");
  }
  if ((local_2e0 & 0x2000000) != 0) {
    std::operator<<((ostream *)local_4d8,"TonkFlag_Connected ");
  }
  if ((local_2e0 & 0x4000000) != 0) {
    std::operator<<((ostream *)local_4d8,"TonkFlag_Disconnected ");
  }
  if ((local_2e0 & 0x10000000) != 0) {
    std::operator<<((ostream *)local_4d8,"TonkFlag_Initiated ");
  }
  if ((local_2e0 & 1) != 0) {
    std::operator<<((ostream *)local_4d8,"TonkFlag_TimeSync ");
  }
  if ((local_2e0 & 0x100) != 0) {
    std::operator<<((ostream *)local_4d8,"TonkFlag_NATMap_Local ");
  }
  if ((local_2e0 & 0x200) != 0) {
    std::operator<<((ostream *)local_4d8,"TonkFlag_NATMap_Remote ");
  }
  poVar1 = std::operator<<((ostream *)local_4d8," AppBPS=");
  std::ostream::operator<<(poVar1,local_2d8);
  poVar1 = std::operator<<((ostream *)local_4d8," ReliableQueueMsec=");
  std::ostream::operator<<(poVar1,local_2d4);
  poVar1 = std::operator<<((ostream *)local_4d8," LowPriQueueMsec=");
  std::ostream::operator<<(poVar1,local_2d0);
  poVar1 = std::operator<<((ostream *)local_4d8," RemoteId=");
  std::ostream::operator<<(poVar1,local_2dc);
  poVar1 = std::operator<<((ostream *)local_4d8," LocalId=");
  std::ostream::operator<<(poVar1,local_300);
  if (local_304 != 0) {
    poVar1 = std::operator<<((ostream *)local_4d8," LocalUPnPPort=");
    std::ostream::operator<<(poVar1,local_304);
  }
  if (local_302 != 0) {
    poVar1 = std::operator<<((ostream *)local_4d8," RemoteUPnPPort=");
    std::ostream::operator<<(poVar1,local_302);
  }
  poVar1 = std::operator<<((ostream *)local_4d8," Self=");
  poVar1 = std::operator<<(poVar1,local_358);
  poVar1 = std::operator<<(poVar1,":");
  std::ostream::operator<<(poVar1,local_330);
  poVar1 = std::operator<<((ostream *)local_4d8," Remote=");
  poVar1 = std::operator<<(poVar1,local_32e);
  poVar1 = std::operator<<(poVar1,":");
  std::ostream::operator<<(poVar1,local_306);
  poVar1 = std::operator<<((ostream *)local_4d8," PeerSeenBPS=");
  std::ostream::operator<<(poVar1,local_2fc);
  poVar1 = std::operator<<((ostream *)local_4d8," PeerSeenLossRate=");
  std::ostream::operator<<(poVar1,local_2f8);
  poVar1 = std::operator<<((ostream *)local_4d8," IncomingBPS=");
  std::ostream::operator<<(poVar1,local_2f0);
  this = (OutputWorker *)std::operator<<((ostream *)local_4d8," IncomingLossRate=");
  std::ostream::operator<<((ostream *)this,local_2ec);
  buffer_00 = (LogStringBuffer *)std::operator<<((ostream *)local_4d8," TripUsec=");
  std::ostream::operator<<((ostream *)buffer_00,local_2e8);
  std::__cxx11::ostringstream::str();
  local_2b0 = &Logger;
  local_2b8 = "tonk_status: ";
  local_2c0 = local_508;
  local_290 = &Logger;
  local_294 = 2;
  local_2a0 = "tonk_status: ";
  local_280 = &Logger;
  local_284 = 2;
  local_2a8 = local_2c0;
  if (DAT_00129388 < 3) {
    local_c8 = &Logger;
    local_cc = 2;
    local_d8 = "tonk_status: ";
    local_e0 = local_2c0;
    logger::LogStringBuffer::LogStringBuffer
              (in_stack_fffffffffffffa30,in_stack_fffffffffffffa28,Trace);
    local_b0 = &DAT_001293b8;
    local_a0 = &Logger;
    local_a8 = local_268;
    local_b8 = local_d8;
    local_c0 = local_e0;
    local_88 = &Logger;
    local_98 = local_b0;
    local_90 = local_a8;
    local_80 = local_b0;
    local_78 = local_a8;
    std::operator<<(aoStack_258,(string *)&DAT_001293b8);
    local_58 = &Logger;
    local_60 = local_a8;
    local_68 = local_b8;
    local_70 = local_c0;
    local_18 = &Logger;
    local_20 = local_a8;
    local_28 = local_b8;
    local_8 = local_a8;
    local_10 = local_b8;
    std::operator<<((ostream *)(local_a8 + 0x10),local_b8);
    local_40 = &Logger;
    local_48 = local_60;
    local_50 = local_70;
    local_30 = local_60;
    local_38 = local_70;
    std::operator<<((ostream *)(local_60 + 0x10),local_70);
    logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(this,buffer_00);
    logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x112571);
  }
  std::__cxx11::string::~string(local_508);
  std::__cxx11::ostringstream::~ostringstream(local_4d8);
  return;
}

Assistant:

void LogTonkStatus(tonk::SDKConnection* connection)
{
    TonkStatus status = connection->GetStatus();
    TonkStatusEx statusEx = connection->GetStatusEx();

    std::ostringstream ss;
    if (status.Flags & TonkFlag_Connecting) {
        ss << "TonkFlag_Connecting ";
    }
    if (status.Flags & TonkFlag_Connected) {
        ss << "TonkFlag_Connected ";
    }
    if (status.Flags & TonkFlag_Disconnected) {
        ss << "TonkFlag_Disconnected ";
    }
    if (status.Flags & TonkFlag_Initiated) {
        ss << "TonkFlag_Initiated ";
    }
    if (status.Flags & TonkFlag_TimeSync) {
        ss << "TonkFlag_TimeSync ";
    }
    if (status.Flags & TonkFlag_NATMap_Local) {
        ss << "TonkFlag_NATMap_Local ";
    }
    if (status.Flags & TonkFlag_NATMap_Remote) {
        ss << "TonkFlag_NATMap_Remote ";
    }
    ss << " AppBPS=" << status.AppBPS;
    ss << " ReliableQueueMsec=" << status.ReliableQueueMsec;
    ss << " LowPriQueueMsec=" << status.LowPriQueueMsec;
    //ss << " ConnectionKey=" << statusEx.ConnectionKey;
    ss << " RemoteId=" << status.LocallyAssignedIdForRemoteHost;
    ss << " LocalId=" << statusEx.RemoteAssignedIdForLocalHost;
    if (statusEx.LocalNATMapExternalPort != 0) {
        ss << " LocalUPnPPort=" << statusEx.LocalNATMapExternalPort;
    }
    if (statusEx.RemoteNATMapExternalPort != 0) {
        ss << " RemoteUPnPPort=" << statusEx.RemoteNATMapExternalPort;
    }
    ss << " Self=" << statusEx.Local.NetworkString << ":" << statusEx.Local.UDPPort;
    ss << " Remote=" << statusEx.Remote.NetworkString << ":" << statusEx.Remote.UDPPort;
    ss << " PeerSeenBPS=" << statusEx.PeerSeenBPS;
    ss << " PeerSeenLossRate=" << statusEx.PeerSeenLossRate;
    ss << " IncomingBPS=" << statusEx.IncomingBPS;
    ss << " IncomingLossRate=" << statusEx.IncomingLossRate;
    ss << " TripUsec=" << statusEx.TripUsec;
    Logger.Info("tonk_status: ", ss.str());
}